

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O1

int av1_get_comp_reference_type_context(MACROBLOCKD *xd)

{
  _Bool _Var1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  MB_MODE_INFO *pMVar7;
  MB_MODE_INFO *pMVar8;
  bool bVar9;
  bool bVar10;
  
  pMVar7 = xd->above_mbmi;
  pMVar8 = xd->left_mbmi;
  _Var1 = xd->up_available;
  if ((_Var1 & xd->left_available) == 1) {
    if ((pMVar7->field_0xa7 & 0x80) == 0) {
      bVar10 = pMVar7->ref_frame[0] < '\x01';
    }
    else {
      bVar10 = false;
    }
    if ((pMVar8->field_0xa7 & 0x80) == 0) {
      bVar9 = pMVar8->ref_frame[0] < '\x01';
    }
    else {
      bVar9 = false;
    }
    iVar6 = 2;
    if (!(bool)(bVar10 & bVar9)) {
      if (bVar9 || bVar10) {
        if (bVar10) {
          pMVar7 = pMVar8;
        }
        if ('\0' < pMVar7->ref_frame[1]) {
          bVar9 = '\x04' < pMVar7->ref_frame[0];
          bVar10 = pMVar7->ref_frame[1] < '\x05';
LAB_0039f3c8:
          return (uint)(byte)(bVar10 ^ bVar9) * 2 + 1;
        }
      }
      else {
        cVar2 = pMVar7->ref_frame[0];
        cVar3 = pMVar7->ref_frame[1];
        cVar4 = pMVar8->ref_frame[0];
        cVar5 = pMVar8->ref_frame[1];
        if (cVar5 < '\x01' && cVar3 < '\x01') {
          bVar9 = (byte)(cVar2 - 5U) < 3;
          bVar10 = (byte)(cVar4 - 8U) < 0xfd;
          goto LAB_0039f3c8;
        }
        if (cVar3 < '\x01' || cVar5 < '\x01') {
          if (cVar3 < '\x01') {
            bVar10 = cVar5 < '\x05' != '\x04' < cVar4 && '\0' < cVar5;
          }
          else {
            bVar10 = cVar3 < '\x05' != '\x04' < cVar2;
          }
          iVar6 = 1;
          if (bVar10) {
            bVar10 = (byte)(cVar2 - 5U) < 3;
            bVar9 = (byte)(cVar4 - 8U) < 0xfd;
LAB_0039f48a:
            return (byte)(bVar9 ^ bVar10) + 3;
          }
        }
        else {
          bVar10 = cVar3 < '\x05' != '\x04' < cVar2;
          bVar9 = cVar5 < '\x05' != '\x04' < cVar4;
          if (((bVar10) || (iVar6 = 0, bVar9)) && (iVar6 = 2, bVar10 && bVar9)) {
            bVar10 = cVar2 == '\x05';
            bVar9 = cVar4 != '\x05';
            goto LAB_0039f48a;
          }
        }
      }
    }
  }
  else {
    iVar6 = 2;
    if (((xd->left_available | _Var1) & 1U) != 0) {
      if (_Var1 != false) {
        pMVar8 = pMVar7;
      }
      if ((((pMVar8->field_0xa7 & 0x80) != 0) || ('\0' < pMVar8->ref_frame[0])) &&
         ('\0' < pMVar8->ref_frame[1])) {
        return (uint)(pMVar8->ref_frame[1] < '\x05' != '\x04' < pMVar8->ref_frame[0]) << 2;
      }
    }
  }
  return iVar6;
}

Assistant:

int av1_get_comp_reference_type_context(const MACROBLOCKD *xd) {
  int pred_context;
  const MB_MODE_INFO *const above_mbmi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mbmi = xd->left_mbmi;
  const int above_in_image = xd->up_available;
  const int left_in_image = xd->left_available;

  if (above_in_image && left_in_image) {  // both edges available
    const int above_intra = !is_inter_block(above_mbmi);
    const int left_intra = !is_inter_block(left_mbmi);

    if (above_intra && left_intra) {  // intra/intra
      pred_context = 2;
    } else if (above_intra || left_intra) {  // intra/inter
      const MB_MODE_INFO *inter_mbmi = above_intra ? left_mbmi : above_mbmi;

      if (!has_second_ref(inter_mbmi))  // single pred
        pred_context = 2;
      else  // comp pred
        pred_context = 1 + 2 * has_uni_comp_refs(inter_mbmi);
    } else {  // inter/inter
      const int a_sg = !has_second_ref(above_mbmi);
      const int l_sg = !has_second_ref(left_mbmi);
      const MV_REFERENCE_FRAME frfa = above_mbmi->ref_frame[0];
      const MV_REFERENCE_FRAME frfl = left_mbmi->ref_frame[0];

      if (a_sg && l_sg) {  // single/single
        pred_context = 1 + 2 * (!(IS_BACKWARD_REF_FRAME(frfa) ^
                                  IS_BACKWARD_REF_FRAME(frfl)));
      } else if (l_sg || a_sg) {  // single/comp
        const int uni_rfc =
            a_sg ? has_uni_comp_refs(left_mbmi) : has_uni_comp_refs(above_mbmi);

        if (!uni_rfc)  // comp bidir
          pred_context = 1;
        else  // comp unidir
          pred_context = 3 + (!(IS_BACKWARD_REF_FRAME(frfa) ^
                                IS_BACKWARD_REF_FRAME(frfl)));
      } else {  // comp/comp
        const int a_uni_rfc = has_uni_comp_refs(above_mbmi);
        const int l_uni_rfc = has_uni_comp_refs(left_mbmi);

        if (!a_uni_rfc && !l_uni_rfc)  // bidir/bidir
          pred_context = 0;
        else if (!a_uni_rfc || !l_uni_rfc)  // unidir/bidir
          pred_context = 2;
        else  // unidir/unidir
          pred_context =
              3 + (!((frfa == BWDREF_FRAME) ^ (frfl == BWDREF_FRAME)));
      }
    }
  } else if (above_in_image || left_in_image) {  // one edge available
    const MB_MODE_INFO *edge_mbmi = above_in_image ? above_mbmi : left_mbmi;

    if (!is_inter_block(edge_mbmi)) {  // intra
      pred_context = 2;
    } else {                           // inter
      if (!has_second_ref(edge_mbmi))  // single pred
        pred_context = 2;
      else  // comp pred
        pred_context = 4 * has_uni_comp_refs(edge_mbmi);
    }
  } else {  // no edges available
    pred_context = 2;
  }

  assert(pred_context >= 0 && pred_context < COMP_REF_TYPE_CONTEXTS);
  return pred_context;
}